

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int local_14;
  int local_10;
  int b;
  int a;
  
  b = 0;
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_689);
  local_10 = 0;
  std::istream::operator>>((istream *)&std::cin,&local_10);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ac);
  local_14 = 0;
  std::istream::operator>>((istream *)&std::cin,&local_14);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10 + local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10 - local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ee);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10 / local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_704);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10 % local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_71a);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10 * local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_724);
  local_10 = local_10 + 1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_73a);
  iVar1 = local_10;
  local_10 = local_10 + 1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_750);
  local_14 = local_14 + -1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_75a);
  iVar1 = local_14;
  local_14 = local_14 + -1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    cout << "Введите число A: ";
    int a = 0; // Объявление и инициализация переменной
    cin >> a; // Мы загружаем данные в переменную a
    cout << "Введите число B (кроме 0): ";
    int b = 0; // Объявление и инициализация переменной b
    cin >> b; // Мы загружаем данные в переменную Ь
    cout << "Результат сложения  " << a + b << endl; // Сложение
    cout << "Результат вычитания: " << a - b << endl; // Вычитание
    cout << "Результат деления: " << a / b << endl; // Деление
    cout << "Остаток от деления: " << a % b << endl; // Остаток от деления
    cout << "Результат умножения: " << a * b << endl; // Умножение
    cout << "Инкремент префиксный переменной a: " << ++a << endl; // Инкремент префиксный
    cout << "Инкремент суффиксный (постфиксный) переменной a: " << a++ << endl; // Инкремент суффиксный (постфиксный)
    cout << "Декремент префиксный переменной b: " << --b << endl; // Декремент префиксный
    cout << "Декремент суффиксный (постфиксный) переменной b: " << b-- << endl; // Декремент суффиксный (постфиксный)

    return 0;
}